

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

void google::protobuf::internal::
     arena_destruct_object<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
               (void *object)

{
  void *pvVar1;
  
  if (*object != *(long *)((long)object + 8)) {
    UnknownFieldSet::ClearFallback((UnknownFieldSet *)object);
  }
  pvVar1 = *object;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)((long)object + 0x10) - (long)pvVar1);
    return;
  }
  return;
}

Assistant:

void arena_destruct_object(void* object) {
  reinterpret_cast<T*>(object)->~T();
}